

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

void __thiscall QDataStream::QDataStream(QDataStream *this,QByteArray *a)

{
  QObject *this_00;
  
  this->d = (void *)0x0;
  this->dev = (QIODevice *)0x0;
  this->owndev = false;
  this->noswap = false;
  this->fpPrecision = '\x01';
  this->q_status = '\0';
  this->byteorder = BigEndian;
  this->ver = 0x17;
  this->transactionDepth = 0;
  this_00 = (QObject *)operator_new(0x10);
  QBuffer::QBuffer((QBuffer *)this_00,(QObject *)0x0);
  QObject::blockSignals(this_00,true);
  QBuffer::setData((QBuffer *)this_00,a);
  (*this_00->_vptr_QObject[0xd])(this_00,1);
  this->dev = (QIODevice *)this_00;
  this->owndev = true;
  return;
}

Assistant:

QDataStream::QDataStream(const QByteArray &a)
{
    QBuffer *buf = new QBuffer;
#ifndef QT_NO_QOBJECT
    buf->blockSignals(true);
#endif
    buf->setData(a);
    buf->open(QIODevice::ReadOnly);
    dev = buf;
    owndev = true;
}